

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall TPZMatrix<Fad<float>_>::Decompose_LDLt(TPZMatrix<Fad<float>_> *this)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  float *pfVar7;
  int i;
  ulong uVar8;
  float *pfVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int sz;
  float fVar13;
  value_type vVar14;
  Fad<float> tmp;
  Fad<float> sum_1;
  Fad<float> val;
  Fad<float> sum;
  Fad<float> local_138;
  Fad<float> local_118;
  Fad<float> local_f8;
  ulong local_d8;
  undefined1 local_d0 [16];
  undefined1 local_c0 [32];
  Fad<float> local_a0;
  Fad<float> local_80;
  Fad<float> *local_60;
  Fad<float> *local_58;
  FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> local_40;
  
  bVar1 = (this->super_TPZBaseMatrix).fDecomposed;
  if (bVar1 != 0) {
    if (bVar1 == 4) {
      return (uint)bVar1;
    }
    Error("Decompose_LDLt <Matrix already Decomposed with other scheme> ",(char *)0x0);
  }
  if ((this->super_TPZBaseMatrix).fRow != (this->super_TPZBaseMatrix).fCol) {
    Error("Decompose_LDLt <Matrix must be square>",(char *)0x0);
  }
  uVar4 = (uint)(this->super_TPZBaseMatrix).fRow;
  if (0 < (int)uVar4) {
    uVar5 = (ulong)(uVar4 & 0x7fffffff);
    local_d8 = 1;
    uVar10 = 0;
    do {
      local_a0.val_ = 0.0;
      local_a0.dx_.num_elts = 0;
      local_a0.dx_.ptr_to_data = (float *)0x0;
      local_a0.defaultVal = 0.0;
      if (uVar10 != 0) {
        uVar11 = 0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_138,this,uVar11,uVar11);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_118,this,uVar11,uVar10);
          local_60 = &local_138;
          local_58 = &local_118;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_f8,this,uVar11,uVar10);
          local_c0._0_8_ = (Fad<float> *)&local_60;
          local_c0._8_8_ = &local_f8;
          Fad<float>::operator+=
                    (&local_a0,
                     (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>
                      *)local_c0);
          Fad<float>::~Fad(&local_f8);
          Fad<float>::~Fad(&local_118);
          Fad<float>::~Fad(&local_138);
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(&local_118,this,uVar10)
      ;
      iVar3 = local_a0.dx_.num_elts;
      iVar2 = local_118.dx_.num_elts;
      local_138.val_ = local_118.val_ - local_a0.val_;
      fVar13 = (float)local_a0.dx_.num_elts;
      if (local_a0.dx_.num_elts < local_118.dx_.num_elts) {
        fVar13 = (float)local_118.dx_.num_elts;
      }
      local_138.dx_.num_elts = 0;
      local_138.dx_.ptr_to_data = (float *)0x0;
      if (0 < (int)fVar13) {
        uVar11 = (ulong)(uint)fVar13;
        local_138.dx_.num_elts = (int)fVar13;
        local_138.dx_.ptr_to_data = (float *)operator_new__(uVar11 * 4);
        if (0 < (int)fVar13) {
          lVar6 = 0;
          do {
            pfVar7 = (float *)((long)local_118.dx_.ptr_to_data + lVar6);
            if ((float)iVar2 == 0.0) {
              pfVar7 = &local_118.defaultVal;
            }
            pfVar9 = (float *)((long)local_a0.dx_.ptr_to_data + lVar6);
            if ((float)iVar3 == 0.0) {
              pfVar9 = &local_a0.defaultVal;
            }
            *(float *)((long)local_138.dx_.ptr_to_data + lVar6) = *pfVar7 - *pfVar9;
            lVar6 = lVar6 + 4;
            uVar11 = uVar11 - 1;
          } while (uVar11 != 0);
        }
      }
      local_138.defaultVal = 0.0;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                (this,uVar10,uVar10,&local_138);
      Fad<float>::~Fad(&local_138);
      Fad<float>::~Fad(&local_118);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&local_138,this,uVar10,uVar10);
      iVar2 = local_138.dx_.num_elts;
      local_80.val_ = local_138.val_;
      local_80.dx_.num_elts = local_138.dx_.num_elts;
      local_80.dx_.ptr_to_data = (float *)0x0;
      if ((long)local_138.dx_.num_elts != 0) {
        uVar11 = (long)local_138.dx_.num_elts * 4;
        if (local_138.dx_.num_elts < 0) {
          uVar11 = 0xffffffffffffffff;
        }
        local_80.dx_.ptr_to_data = (float *)operator_new__(uVar11);
        MEM_CPY<float>::copy
                  ((MEM_CPY<float> *)local_80.dx_.ptr_to_data,
                   (EVP_PKEY_CTX *)local_138.dx_.ptr_to_data,(EVP_PKEY_CTX *)(ulong)(uint)iVar2);
      }
      local_80.defaultVal = local_138.defaultVal;
      fVar13 = ABS(local_80.val_);
      Fad<float>::~Fad(&local_80);
      if (fVar13 < 1e-12) {
        Error("Decompose_LDLt <Zero on diagonal>",(char *)0x0);
      }
      uVar11 = uVar10 + 1;
      uVar12 = local_d8;
      if (uVar11 < uVar5) {
        do {
          local_118.val_ = 0.0;
          local_118.dx_.num_elts = 0;
          local_118.dx_.ptr_to_data = (float *)0x0;
          local_118.defaultVal = 0.0;
          if (uVar10 != 0) {
            uVar8 = 0;
            do {
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (&local_f8,this,uVar8,uVar8);
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        ((Fad<float> *)local_c0,this,uVar10,uVar8);
              local_40.fadexpr_.left_ = &local_f8;
              local_40.fadexpr_.right_ = (Fad<float> *)local_c0;
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        ((Fad<float> *)&local_60,this,uVar12,uVar8);
              local_d0._0_8_ = &local_40;
              local_d0._8_8_ = (Fad<float> *)&local_60;
              Fad<float>::operator+=
                        (&local_118,
                         (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>
                          *)local_d0);
              Fad<float>::~Fad((Fad<float> *)&local_60);
              Fad<float>::~Fad((Fad<float> *)local_c0);
              Fad<float>::~Fad(&local_f8);
              uVar8 = uVar8 + 1;
            } while (uVar10 != uVar8);
          }
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)local_c0,this,uVar12,uVar10)
          ;
          local_d0._8_8_ = &local_118;
          local_60 = (Fad<float> *)local_d0;
          local_58 = &local_138;
          local_f8.val_ = ((float)local_c0._0_4_ - local_118.val_) / local_138.val_;
          fVar13 = (float)local_118.dx_.num_elts;
          if (local_118.dx_.num_elts < (int)local_c0._8_4_) {
            fVar13 = (float)local_c0._8_4_;
          }
          if ((int)fVar13 <= local_138.dx_.num_elts) {
            fVar13 = (float)local_138.dx_.num_elts;
          }
          local_f8.dx_.num_elts = 0;
          local_f8.dx_.ptr_to_data = (float *)0x0;
          local_d0._0_8_ = (FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)local_c0;
          if ((int)fVar13 < 1) {
            local_f8.defaultVal = 0.0;
          }
          else {
            local_f8.dx_.num_elts = (int)fVar13;
            local_f8.dx_.ptr_to_data = (float *)operator_new__((ulong)(uint)fVar13 * 4);
            local_f8.defaultVal = 0.0;
            if (0 < (int)fVar13) {
              uVar8 = 0;
              do {
                vVar14 = FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_Fad<float>_>
                         ::dx((FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_Fad<float>_>
                               *)&local_60,(int)uVar8);
                local_f8.dx_.ptr_to_data[uVar8] = vVar14;
                uVar8 = uVar8 + 1;
              } while ((uint)fVar13 != uVar8);
            }
          }
          Fad<float>::~Fad((Fad<float> *)local_c0);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,uVar12,uVar10,&local_f8);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,uVar10,uVar12,&local_f8);
          Fad<float>::~Fad(&local_f8);
          Fad<float>::~Fad(&local_118);
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar5);
      }
      Fad<float>::~Fad(&local_138);
      Fad<float>::~Fad(&local_a0);
      local_d8 = local_d8 + 1;
      uVar10 = uVar11;
    } while (uVar11 != uVar5);
  }
  (this->super_TPZBaseMatrix).fDecomposed = '\x04';
  (this->super_TPZBaseMatrix).fDefPositive = '\0';
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LDLt() {
	
	if (  fDecomposed && fDecomposed != ELDLt) {
		Error( "Decompose_LDLt <Matrix already Decomposed with other scheme> " );
	} else if(fDecomposed ) {
		return ELDLt;
	}
	if ( Rows()!=Cols() ) Error( "Decompose_LDLt <Matrix must be square>" );
	
	const int dim=Rows();
	
	for (auto j = 0; j < dim; j++ ) {
        TVar sum = 0;
		for (auto k=0; k<j; k++) {
            if constexpr(is_complex<TVar>::value){
                sum +=GetVal(k,k)*std::conj(GetVal(k,j))*GetVal(k,j);
            }else{
                sum +=GetVal(k,k)*GetVal(k,j)*GetVal(k,j);
            }   
		}
        PutVal( j,j,GetVal(j,j) - sum );
		TVar tmp = GetVal(j,j);
		if ( IsZero(tmp) ) Error( "Decompose_LDLt <Zero on diagonal>" );
        for(auto l=j+1; l<dim;l++) {
            TVar sum = 0;
            for (auto k=0; k<j; k++) {
                if constexpr(is_complex<TVar>::value){
                    sum += GetVal(k,k)*std::conj(GetVal(j,k))*GetVal(l,k);
                }else{
                    sum += GetVal(k,k)*GetVal(j,k)*GetVal(l,k);
                }
			}
            TVar val = (GetVal(l,j) - sum)/tmp;
            PutVal(l,j,val);
            if constexpr(is_complex<TVar>::value){val=std::conj(val);}
            PutVal(j,l,val);
		}
	}
	fDecomposed  = ELDLt;
	fDefPositive = 0;
	return( 1 );
}